

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O3

bool __thiscall
FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadFuncSin<Fad<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>
::hasFastAccess(FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadFuncSin<Fad<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>
                *this)

{
  if ((((((((this->left_->fadexpr_).left_)->fadexpr_).expr_)->fadexpr_).expr_.dx_.num_elts != 0) &&
      ((((this->left_->fadexpr_).right_)->fadexpr_).expr_.dx_.num_elts != 0)) &&
     ((((this->right_->fadexpr_).left_)->fadexpr_).expr_.dx_.num_elts != 0)) {
    return (((this->right_->fadexpr_).right_)->fadexpr_).expr_.dx_.num_elts != 0;
  }
  return false;
}

Assistant:

bool hasFastAccess() const { return left_.hasFastAccess() && right_.hasFastAccess();}